

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::DecommitNow(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
              *this,bool all)

{
  RealCount *pRVar1;
  uint uVar2;
  PageMemoryData *pPVar3;
  HANDLE pVVar4;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar5;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> *pDVar6;
  code *pcVar7;
  bool bVar8;
  byte bVar9;
  int iVar10;
  DWORD DVar11;
  uint uVar12;
  undefined4 *puVar13;
  FreePageEntry *__s;
  size_t *psVar14;
  ThreadContextId pvVar15;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *pDVar16;
  HANDLE pVVar17;
  size_t *psVar18;
  ulong uVar19;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *pPVar20;
  size_t sVar21;
  char16_t *form;
  long lVar22;
  ulong uVar23;
  CriticalSection *this_00;
  size_t pageToDecommit;
  undefined1 local_58 [8];
  EditingIterator i;
  
  iVar10 = (*this->_vptr_PageAllocatorBase[3])();
  if ((char)iVar10 != '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x797,"(!this->HasMultiThreadAccess())","!this->HasMultiThreadAccess()");
    if (!bVar8) goto LAB_006ff36d;
    *puVar13 = 0;
  }
  if ((DAT_015bf420 == '\x01') && (bVar8 = HasZeroPageQueue(this), bVar8)) {
    __s = PopPendingZeroPage(this);
    if (__s == (FreePageEntry *)0x0) {
      i.super_Iterator.current = (NodeBase *)0x0;
    }
    else {
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      psVar14 = &this->committedBytes;
      i.super_Iterator.current = (NodeBase *)0x0;
      do {
        if (this->waitingToEnterIdleDecommit != false) goto LAB_006fe7c1;
        bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
        if (bVar8) {
          pvVar15 = JsUtil::ExternalApi::GetCurrentThreadContextId();
          DVar11 = GetCurrentThreadId();
          Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar15,(ulong)DVar11,this);
          if (this->debugName != (char16 *)0x0) {
            Output::Print(L"[%s] ");
          }
          Output::Print(L"Freeing page from zero queue","");
          Output::Print(L"\n");
          bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
          if (bVar8) {
            (*this->_vptr_PageAllocatorBase[5])();
          }
          Output::Flush();
        }
        pPVar20 = __s->segment;
        uVar2 = __s->pageCount;
        uVar19 = (ulong)uVar2;
        pDVar16 = GetSegmentList(this,pPVar20);
        if (pDVar16 ==
            (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *
            )0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x7cb,"(fromSegmentList != nullptr)","fromSegmentList != nullptr");
          if (!bVar8) goto LAB_006ff36d;
          *puVar13 = 0;
        }
        if (all) {
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitPages<false>
                    (pPVar20,__s,uVar2);
          uVar23 = uVar19 * 0x1000;
          SubUsedBytes(this,uVar23);
          pPVar3 = this->memoryData;
          psVar18 = psVar14;
          if (pPVar3 != (PageMemoryData *)0x0) {
            *psVar14 = *psVar14 + uVar19 * -0x1000;
            pPVar3->releasePageCount = (ulong)uVar2 + pPVar3->releasePageCount;
            pPVar3->decommitPageCount = (ulong)uVar2 + pPVar3->decommitPageCount;
            psVar18 = &pPVar3->currentCommittedPageCount;
            uVar23 = uVar19;
          }
          *psVar18 = *psVar18 - uVar23;
          uVar12 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::GetAvailablePageCount
                             (pPVar20);
          if (uVar12 != pPVar20->decommitPageCount) goto LAB_006fe6ff;
          LogFreePartiallyDecommittedPageSegment(this,pPVar20);
          DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
          RemoveElement<Memory::NoThrowHeapAllocator>
                    (pDVar16,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,pPVar20);
          i.super_Iterator.current =
               (NodeBase *)
               ((long)&(i.super_Iterator.current)->next + (ulong)this->maxAllocPageCount);
        }
        else {
          pVVar4 = this->processHandle;
          pVVar17 = GetCurrentProcess();
          if (pVVar4 != pVVar17) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar13 = 1;
            bVar8 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                               ,0x7e3,"(this->processHandle == GetCurrentProcess())",
                               "this->processHandle == GetCurrentProcess()");
            if (!bVar8) goto LAB_006ff36d;
            *puVar13 = 0;
          }
          memset(__s,0,(ulong)(uVar2 << 0xc));
          PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::ReleasePages(pPVar20,__s,uVar2);
          SubUsedBytes(this,uVar19 << 0xc);
          if (this->memoryData != (PageMemoryData *)0x0) {
            psVar18 = &this->memoryData->releasePageCount;
            *psVar18 = *psVar18 + uVar19;
          }
LAB_006fe6ff:
          TransferSegment(this,pPVar20,pDVar16);
        }
        __s = PopPendingZeroPage(this);
      } while (__s != (FreePageEntry *)0x0);
    }
    this_00 = &this->backgroundPageQueue->backgroundPageQueueCriticalSection;
    CCLock::Enter(&this_00->super_CCLock);
    this->hasZeroQueuedPages = false;
    bVar8 = HasZeroQueuedPages(this);
    if (bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x7f2,"(!this->HasZeroQueuedPages())","!this->HasZeroQueuedPages()");
      if (!bVar8) goto LAB_006ff36d;
      *puVar13 = 0;
    }
    CCLock::Leave(&this_00->super_CCLock);
LAB_006fe7c1:
    FlushBackgroundPages(this);
  }
  else {
    i.super_Iterator.current = (NodeBase *)0x0;
  }
  if (this->freePageCount == 0) {
    if (this->debugMinFreePageCount == 0) {
      return;
    }
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x7fc,"(debugMinFreePageCount == 0)","debugMinFreePageCount == 0");
    if (bVar8) {
      *puVar13 = 0;
      return;
    }
    goto LAB_006ff36d;
  }
  bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if (bVar8) {
    pvVar15 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar11 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar15,(ulong)DVar11,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"Decommit now","");
    Output::Print(L"\n");
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (bVar8) {
      (*this->_vptr_PageAllocatorBase[5])();
    }
    Output::Flush();
  }
  UpdateMinFreePageCount(this);
  if (all) {
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      pvVar15 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar11 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar15,(ulong)DVar11,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      form = L"Full decommit";
      uVar23 = 0;
LAB_006fea82:
      Output::Print(form,"");
      Output::Print(L"\n");
      bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
      if (bVar8) {
        (*this->_vptr_PageAllocatorBase[5])();
      }
      Output::Flush();
    }
    else {
      uVar23 = 0;
    }
  }
  else {
    uVar19 = this->freePageCount;
    uVar23 = this->minFreePageCount;
    if (uVar19 < uVar23) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x811,"(this->minFreePageCount <= this->freePageCount)",
                         "this->minFreePageCount <= this->freePageCount");
      if (!bVar8) goto LAB_006ff36d;
      *puVar13 = 0;
      uVar19 = this->freePageCount;
      uVar23 = this->minFreePageCount;
    }
    uVar19 = uVar19 - (uVar23 >> 1);
    uVar23 = 0x1000;
    if (0x1000 < uVar19) {
      uVar23 = uVar19;
    }
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (bVar8) {
      pvVar15 = JsUtil::ExternalApi::GetCurrentThreadContextId();
      DVar11 = GetCurrentThreadId();
      Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar15,(ulong)DVar11,this);
      if (this->debugName != (char16 *)0x0) {
        Output::Print(L"[%s] ");
      }
      form = L"Partial decommit";
      goto LAB_006fea82;
    }
  }
  pageToDecommit = this->freePageCount - uVar23;
  if (this->freePageCount < uVar23 || pageToDecommit == 0) {
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
    if (!bVar8) {
      return;
    }
    pvVar15 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar11 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar15,(ulong)DVar11,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"No pages to decommit","");
    Output::Print(L"\n");
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (bVar8) {
      (*this->_vptr_PageAllocatorBase[5])();
    }
    Output::Flush();
    return;
  }
  bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if (bVar8) {
    pvVar15 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar11 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar15,(ulong)DVar11,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"Decommit page count = %d",pageToDecommit);
    Output::Print(L"\n");
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (bVar8) {
      (*this->_vptr_PageAllocatorBase[5])();
    }
    Output::Flush();
  }
  bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if (bVar8) {
    pvVar15 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar11 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar15,(ulong)DVar11,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"Free page count = %d",this->freePageCount);
    Output::Print(L"\n");
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (bVar8) {
      (*this->_vptr_PageAllocatorBase[5])();
    }
    Output::Flush();
  }
  bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if (bVar8) {
    pvVar15 = JsUtil::ExternalApi::GetCurrentThreadContextId();
    DVar11 = GetCurrentThreadId();
    Output::Print(L"%p : %p> PageAllocator(%p): ",pvVar15,(ulong)DVar11,this);
    if (this->debugName != (char16 *)0x0) {
      Output::Print(L"[%s] ");
    }
    Output::Print(L"New free page count = %d",uVar23);
    Output::Print(L"\n");
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (bVar8) {
      (*this->_vptr_PageAllocatorBase[5])();
    }
    Output::Flush();
  }
  pDVar16 = &this->decommitSegments;
  local_58 = (undefined1  [8])pDVar16;
  i.super_Iterator.list = pDVar16;
  puVar13 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  lVar22 = 0;
  do {
    if (pageToDecommit == 0) goto LAB_006ff072;
    if (i.super_Iterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)0x0
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_006ff36d;
      *puVar13 = 0;
    }
    pDVar5 = ((i.super_Iterator.list)->
             super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
             next.list;
    if ((undefined1  [8])pDVar5 == local_58) break;
    i.super_Iterator.list = pDVar5;
    pPVar20 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
              ::Iterator::Data((Iterator *)local_58);
    sVar21 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                       (pPVar20,pageToDecommit);
    this->committedBytes = this->committedBytes + sVar21 * -0x1000;
    pPVar3 = this->memoryData;
    if (pPVar3 != (PageMemoryData *)0x0) {
      pPVar3->decommitPageCount = pPVar3->decommitPageCount + sVar21;
      pPVar3->currentCommittedPageCount = pPVar3->currentCommittedPageCount - sVar21;
    }
    pPVar20 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
              ::Iterator::Data((Iterator *)local_58);
    if (pPVar20->decommitPageCount == this->maxAllocPageCount) {
      pPVar20 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                ::Iterator::Data((Iterator *)local_58);
      LogFreePartiallyDecommittedPageSegment(this,pPVar20);
      DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
      EditingIterator::RemoveCurrent<Memory::NoThrowHeapAllocator>
                ((EditingIterator *)local_58,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance
                );
      i.super_Iterator.current =
           (NodeBase *)((long)&(i.super_Iterator.current)->next + (ulong)this->maxAllocPageCount);
    }
    lVar22 = lVar22 + sVar21;
    pageToDecommit = pageToDecommit - sVar21;
  } while (this->waitingToEnterIdleDecommit != true);
  bVar9 = this->waitingToEnterIdleDecommit;
  if (pageToDecommit == 0 || (bool)bVar9 != false) {
LAB_006fee41:
    pDVar16 = i.super_Iterator.list;
    if (bVar9 == 0) goto LAB_006ff087;
  }
  else {
    pDVar5 = &this->emptySegments;
    if ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
        (this->emptySegments).
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>.next.
        base != pDVar5) {
LAB_006fef1e:
      uVar2 = this->maxAllocPageCount;
      pPVar20 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                ::Head(pDVar5);
      if (uVar2 <= pageToDecommit) {
        if (pPVar20->decommitPageCount != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x84c,"(emptySegments.Head().GetDecommitPageCount() == 0)",
                             "emptySegments.Head().GetDecommitPageCount() == 0");
          if (!bVar8) goto LAB_006ff36d;
          *puVar13 = 0;
        }
        pPVar20 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Head(pDVar5);
        LogFreeSegment(this,&pPVar20->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>);
        DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
        RemoveHead<Memory::NoThrowHeapAllocator>
                  (pDVar5,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance);
        uVar19 = (ulong)this->maxAllocPageCount;
        pageToDecommit = pageToDecommit - uVar19;
        i.super_Iterator.current = (NodeBase *)((long)&(i.super_Iterator.current)->next + uVar19);
        lVar22 = lVar22 + uVar19;
        bVar9 = this->waitingToEnterIdleDecommit;
        if (((bool)bVar9 == false) && (pageToDecommit != 0)) goto code_r0x006fefdc;
        goto LAB_006fee41;
      }
      sVar21 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                         (pPVar20,pageToDecommit);
      this->committedBytes = this->committedBytes + sVar21 * -0x1000;
      pPVar3 = this->memoryData;
      if (pPVar3 != (PageMemoryData *)0x0) {
        pPVar3->decommitPageCount = pPVar3->decommitPageCount + sVar21;
        pPVar3->currentCommittedPageCount = pPVar3->currentCommittedPageCount - sVar21;
      }
      if (sVar21 != pageToDecommit) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar13 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0x85d,"(pageDecommitted == pageToDecommit)",
                           "pageDecommitted == pageToDecommit");
        if (!bVar8) goto LAB_006ff36d;
        *puVar13 = 0;
      }
      DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
      MoveHeadTo(pDVar5,pDVar16);
      lVar22 = lVar22 + sVar21;
LAB_006ff072:
      bVar9 = this->waitingToEnterIdleDecommit;
      pageToDecommit = 0;
      if ((bool)bVar9 == false) goto LAB_006ff087;
      goto LAB_006ff277;
    }
LAB_006ff087:
    pDVar16 = &this->segments;
    local_58 = (undefined1  [8])pDVar16;
    i.super_Iterator.list = pDVar16;
    if (pageToDecommit != 0) {
      do {
        i.super_Iterator.list =
             (pDVar16->
             super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).
             next.list;
        if ((undefined1  [8])i.super_Iterator.list == local_58) goto LAB_006ff20a;
        pPVar20 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)local_58);
        sVar21 = PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
                           (pPVar20,pageToDecommit);
        this->committedBytes = this->committedBytes + sVar21 * -0x1000;
        pPVar3 = this->memoryData;
        if (pPVar3 != (PageMemoryData *)0x0) {
          pPVar3->decommitPageCount = pPVar3->decommitPageCount + sVar21;
          pPVar3->currentCommittedPageCount = pPVar3->currentCommittedPageCount - sVar21;
        }
        pPVar20 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)local_58);
        if (pPVar20->decommitPageCount == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x86e,"(i.Data().GetDecommitPageCount() != 0)",
                             "i.Data().GetDecommitPageCount() != 0");
          if (!bVar8) goto LAB_006ff36d;
          *puVar13 = 0;
        }
        pPVar20 = DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  ::Iterator::Data((Iterator *)local_58);
        if (this->maxAllocPageCount < pPVar20->decommitPageCount) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar13 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x86f,"(i.Data().GetDecommitPageCount() <= maxAllocPageCount)",
                             "i.Data().GetDecommitPageCount() <= maxAllocPageCount");
          if (!bVar8) goto LAB_006ff36d;
          *puVar13 = 0;
        }
        pDVar6 = ((i.super_Iterator.list)->
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 ).next.base;
        pDVar16 = ((i.super_Iterator.list)->
                  super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  ).prev.list;
        (pDVar16->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next.
        base = pDVar6;
        pDVar6->prev = ((i.super_Iterator.list)->
                       super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                       ).prev;
        pDVar6 = (this->decommitSegments).
                 super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                 .next.base;
        ((i.super_Iterator.list)->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).prev
             = pDVar6->prev;
        ((i.super_Iterator.list)->
        super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>).next.
        base = pDVar6;
        (((pDVar6->prev).base)->next).list = i.super_Iterator.list;
        (pDVar6->prev).list = i.super_Iterator.list;
        ((RealCount *)((long)local_58 + 0x10))->count =
             ((RealCount *)((long)local_58 + 0x10))->count - 1;
        pRVar1 = &(this->decommitSegments).super_RealCount;
        pRVar1->count = pRVar1->count + 1;
        lVar22 = lVar22 + sVar21;
        pageToDecommit = pageToDecommit - sVar21;
        bVar9 = this->waitingToEnterIdleDecommit;
        if ((bool)bVar9 == true) goto LAB_006ff20a;
        i.super_Iterator.list = pDVar16;
      } while (pageToDecommit != 0);
    }
    pageToDecommit = 0;
    pDVar16 = i.super_Iterator.list;
  }
LAB_006ff20a:
  i.super_Iterator.list = pDVar16;
  if (pageToDecommit == 0) {
    pageToDecommit = 0;
  }
  else {
    if ((bVar9 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0x87b,"(pageToDecommit == 0 || this->waitingToEnterIdleDecommit)",
                         "pageToDecommit == 0 || this->waitingToEnterIdleDecommit");
      if (!bVar8) goto LAB_006ff36d;
      *puVar13 = 0;
      bVar9 = this->waitingToEnterIdleDecommit;
    }
    if ((bVar9 & 1) != 0) {
      this->idleDecommitBackOffCount = this->idleDecommitBackOffCount + 1;
    }
  }
LAB_006ff277:
  uVar23 = pageToDecommit + uVar23;
  if (this->freePageCount != uVar23 + lVar22) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x884,
                       "(this->freePageCount == newFreePageCount + decommitCount + pageToDecommit)",
                       "this->freePageCount == newFreePageCount + decommitCount + pageToDecommit");
    if (!bVar8) {
LAB_006ff36d:
      pcVar7 = (code *)invalidInstructionException();
      (*pcVar7)();
    }
    *puVar13 = 0;
  }
  this->freePageCount = uVar23;
  if (uVar23 < this->debugMinFreePageCount) {
    this->debugMinFreePageCount = uVar23;
  }
  Check(this);
  this->decommitPageCount = this->decommitPageCount + (lVar22 - (long)i.super_Iterator.current);
  bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Trace,PageAllocatorPhase);
  if (bVar8) {
    bVar8 = Js::Phases::IsEnabled(&this->pageAllocatorFlagTable->Stats,PageAllocatorPhase);
    if (bVar8) {
      Output::Print(L" After decommit now:\n");
      (*this->_vptr_PageAllocatorBase[5])();
    }
    Output::Flush();
  }
  return;
code_r0x006fefdc:
  if ((DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *)
      (pDVar5->super_DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
      ).next.base == pDVar5) goto LAB_006ff087;
  goto LAB_006fef1e;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::DecommitNow(bool all)
{
    Assert(!this->HasMultiThreadAccess());

#ifdef ENABLE_BASIC_TELEMETRY
    if (this->decommitStats != nullptr)
    {
        this->decommitStats->numDecommitCalls++;
        if (this->decommitStats->lastLeaveDecommitRegion.ToMicroseconds() > 0)
        {
            Js::TickDelta delta = Js::Tick::Now() - this->decommitStats->lastLeaveDecommitRegion;
            if (delta > this->decommitStats->maxDeltaBetweenDecommitRegionLeaveAndDecommit)
            {
                this->decommitStats->maxDeltaBetweenDecommitRegionLeaveAndDecommit = delta;
            }
        }
    }
#endif

    size_t deleteCount = 0;

#if ENABLE_BACKGROUND_PAGE_ZEROING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        // First, drain the zero page queue.
        // This will cause the free page count to be accurate
        if (HasZeroPageQueue())
        {
            int numZeroPagesFreed = 0;

            // There might be queued zero pages.  Drain them first
            bool zeroPageQueueEmpty = false;
            while (true)
            {
                FreePageEntry * freePageEntry = PopPendingZeroPage();
                if (freePageEntry == nullptr)
                {
                    zeroPageQueueEmpty = true;
                    break;
                }

                // Back-off from decommit if we are trying to enter IdleDecommit again.
                if (this->waitingToEnterIdleDecommit)
                {
                    break;
                }

                PAGE_ALLOC_TRACE_AND_STATS_0(_u("Freeing page from zero queue"));
                TPageSegment * segment = freePageEntry->segment;
                uint pageCount = freePageEntry->pageCount;

                numZeroPagesFreed += pageCount;

                DListBase<TPageSegment> * fromSegmentList = GetSegmentList(segment);
                Assert(fromSegmentList != nullptr);

                // Check for all here, since the actual free page count can't be determined
                // until we've flushed the zeroed page queue
                if (all)
                {
                    // Decommit them immediately if we are decommitting all pages.
                    segment->template DecommitPages<false>(freePageEntry, pageCount);
                    LogFreePages(pageCount);
                    LogDecommitPages(pageCount);

                    if (segment->IsAllDecommitted())
                    {
                        LogFreePartiallyDecommittedPageSegment(segment);
                        fromSegmentList->RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);

                        deleteCount += maxAllocPageCount;

                        continue;
                    }
                }
                else
                {
                    // Zero them and release them in case we don't decommit them.
                    Assert(this->processHandle == GetCurrentProcess());
                    memset(freePageEntry, 0, pageCount * AutoSystemInfo::PageSize);
                    segment->ReleasePages(freePageEntry, pageCount);
                    LogFreePages(pageCount);
                }

                TransferSegment(segment, fromSegmentList);
            }

            // Take the lock to make sure the recycler thread has finished zeroing out the pages after
            // we drained the queue
            if(zeroPageQueueEmpty)
            {
                AutoCriticalSection autoCS(&backgroundPageQueue->backgroundPageQueueCriticalSection);
                this->hasZeroQueuedPages = false;
                Assert(!this->HasZeroQueuedPages());
            }

            FlushBackgroundPages();
        }
    }
#endif

    if (this->freePageCount == 0)
    {
        Assert(debugMinFreePageCount == 0);
        return;
    }

    PAGE_ALLOC_TRACE_AND_STATS_0(_u("Decommit now"));

    // minFreePageCount is not updated on every page allocate,
    // so we have to do a final update here.
    UpdateMinFreePageCount();

    size_t newFreePageCount;

    if (all)
    {
        newFreePageCount = this->GetFreePageLimit();

        PAGE_ALLOC_TRACE_AND_STATS_0(_u("Full decommit"));
    }
    else
    {
        // Decommit half the min free page count since last partial decommit
        Assert(this->minFreePageCount <= this->freePageCount);
        newFreePageCount = this->freePageCount - (this->minFreePageCount / 2);

        // Ensure we don't decommit down to fewer than our partial decommit minimum
        newFreePageCount = max(newFreePageCount, static_cast<size_t>(MinPartialDecommitFreePageCount));

        PAGE_ALLOC_TRACE_AND_STATS_0(_u("Partial decommit"));
    }

    if (newFreePageCount >= this->freePageCount)
    {
        PAGE_ALLOC_TRACE_AND_STATS_0(_u("No pages to decommit"));
        return;
    }

    size_t pageToDecommit = this->freePageCount - newFreePageCount;

    PAGE_ALLOC_TRACE_AND_STATS(_u("Decommit page count = %d"), pageToDecommit);
    PAGE_ALLOC_TRACE_AND_STATS(_u("Free page count = %d"), this->freePageCount);
    PAGE_ALLOC_TRACE_AND_STATS(_u("New free page count = %d"), newFreePageCount);

    size_t decommitCount = 0;


    // decommit from page that already has other decommitted page already
    {
        typename DListBase<TPageSegment>::EditingIterator i(&decommitSegments);

        while (pageToDecommit > 0  && i.Next())
        {
            size_t pageDecommitted = i.Data().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            if (i.Data().GetDecommitPageCount() == maxAllocPageCount)
            {
                LogFreePartiallyDecommittedPageSegment(&i.Data());
                i.RemoveCurrent(&NoThrowNoMemProtectHeapAllocator::Instance);

                deleteCount += maxAllocPageCount;

            }
            pageToDecommit -= pageDecommitted;

            // Back-off from decommit if we are trying to enter IdleDecommit again.
            if (this->waitingToEnterIdleDecommit)
            {
                break;
            }
        }
    }

    // decommit pages that are empty.
    // back-off from decommit if we are trying to enter IdleDecommit again.
    while (!this->waitingToEnterIdleDecommit && pageToDecommit > 0 && !emptySegments.Empty())
    {
        if (pageToDecommit >= maxAllocPageCount)
        {
            Assert(emptySegments.Head().GetDecommitPageCount() == 0);
            LogFreeSegment(&emptySegments.Head());
            emptySegments.RemoveHead(&NoThrowNoMemProtectHeapAllocator::Instance);

            pageToDecommit -= maxAllocPageCount;

            decommitCount += maxAllocPageCount;
            deleteCount += maxAllocPageCount;

        }
        else
        {
            size_t pageDecommitted = emptySegments.Head().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            Assert(pageDecommitted == pageToDecommit);
            emptySegments.MoveHeadTo(&decommitSegments);
            pageToDecommit = 0;
        }
    }

    if(!this->waitingToEnterIdleDecommit)
    {
        typename DListBase<TPageSegment>::EditingIterator i(&segments);

        while (pageToDecommit > 0  && i.Next())
        {
            size_t pageDecommitted = i.Data().DecommitFreePages(pageToDecommit);
            LogDecommitPages(pageDecommitted);

            decommitCount += pageDecommitted;

            Assert(i.Data().GetDecommitPageCount() != 0);
            Assert(i.Data().GetDecommitPageCount() <= maxAllocPageCount);
            i.MoveCurrentTo(&decommitSegments);
            pageToDecommit -= pageDecommitted;

            // Back-off from decommit if we are trying to enter IdleDecommit again.
            if (this->waitingToEnterIdleDecommit)
            {
                break;
            }
        }
    }

    Assert(pageToDecommit == 0 || this->waitingToEnterIdleDecommit);
#if DBG
    if (pageToDecommit != 0 && this->waitingToEnterIdleDecommit)
    {
        this->idleDecommitBackOffCount++;
    }
#endif

#if DBG_DUMP
    Assert(this->freePageCount == newFreePageCount + decommitCount + pageToDecommit);
#endif

    // If we had to back-off from decommiting then we may still have some free pages left to decommit.
    this->freePageCount = newFreePageCount + pageToDecommit;

#ifdef ENABLE_BASIC_TELEMETRY
    if (this->decommitStats != nullptr)
    {
        this->decommitStats->numPagesDecommitted += decommitCount;
        this->decommitStats->numFreePageCount += newFreePageCount + pageToDecommit;
    }
#endif

#if DBG
    UpdateMinimum(this->debugMinFreePageCount, this->freePageCount);
    Check();
#endif
#if DBG_DUMP
    this->decommitPageCount += (decommitCount - deleteCount);
    if (CUSTOM_PHASE_TRACE1(this->pageAllocatorFlagTable, Js::PageAllocatorPhase))
    {
        if (CUSTOM_PHASE_STATS1(this->pageAllocatorFlagTable, Js::PageAllocatorPhase))
        {
            Output::Print(_u(" After decommit now:\n"));
            this->DumpStats();
        }
        Output::Flush();
    }
#endif
}